

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImageFileMem::copy_data(CVmImageFileMem *this,char *buf,size_t len)

{
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  
  if (*(ulong *)(in_RDI + 0x10) < *(long *)(in_RDI + 0x18) + in_RDX) {
    err_throw(0);
  }
  memcpy(in_RSI,(void *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x18)),in_RDX);
  *(size_t *)(in_RDI + 0x18) = in_RDX + *(long *)(in_RDI + 0x18);
  return;
}

Assistant:

void CVmImageFileMem::copy_data(char *buf, size_t len)
{
    /* if we're past the end of the file, throw an error */
    if (pos_ + len > len_)
        err_throw(VMERR_READ_PAST_IMG_END);

    /* copy data into the caller's buffer */
    memcpy(buf, mem_ + pos_, len);

    /* seek past the data */
    pos_ += len;
}